

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

bool __thiscall
CheaterBotStrategy::exchangeCountryOwnership
          (CheaterBotStrategy *this,Player *defendingPlayer,Country *toExchange)

{
  pointer ppCVar1;
  Player *pPVar2;
  vector<Map::Country*,std::allocator<Map::Country*>> *this_00;
  iterator __position;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  long lVar4;
  ulong uVar5;
  pointer ppCVar6;
  pointer __src;
  int iVar7;
  ulong uVar8;
  
  ppCVar1 = (defendingPlayer->pOwnedCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar4 = (long)(defendingPlayer->pOwnedCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppCVar1;
  if (lVar4 != 0) {
    uVar5 = lVar4 >> 3;
    iVar7 = -1;
    lVar4 = 0;
    do {
      if (*ppCVar1[lVar4]->cyID == *toExchange->cyID) {
        if (iVar7 != -1) {
          return false;
        }
        iVar7 = (int)lVar4;
      }
      lVar4 = lVar4 + 1;
    } while (uVar5 + (uVar5 == 0) != lVar4);
    if (iVar7 != -1) {
      pPVar2 = (this->super_PlayerStrategy).player;
      *toExchange->pPlayerOwnerId = *pPVar2->pPlayerId;
      uVar8 = (ulong)iVar7;
      if (uVar5 <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      this_00 = (vector<Map::Country*,std::allocator<Map::Country*>> *)pPVar2->pOwnedCountries;
      __position._M_current = *(Country ***)(this_00 + 8);
      if (__position._M_current == *(Country ***)(this_00 + 0x10)) {
        std::vector<Map::Country*,std::allocator<Map::Country*>>::
        _M_realloc_insert<Map::Country*const&>(this_00,__position,ppCVar1 + uVar8);
      }
      else {
        *__position._M_current = ppCVar1[uVar8];
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      pvVar3 = defendingPlayer->pOwnedCountries;
      ppCVar1 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppCVar6 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      __src = ppCVar1 + uVar8 + 1;
      if (__src != ppCVar6) {
        memmove(ppCVar1 + uVar8,__src,(long)ppCVar6 - (long)__src);
        ppCVar6 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppCVar6 + -1;
      return true;
    }
  }
  return false;
}

Assistant:

bool CheaterBotStrategy::exchangeCountryOwnership(Player* defendingPlayer, Map::Country* toExchange) {
    int toExchangeIndex = -1;

    for (int i = 0; i < defendingPlayer->getOwnedCountries()->size(); i++) {
        if (defendingPlayer->getOwnedCountries()->at(i)->getCountryId() == toExchange->getCountryId()) {
            if (toExchangeIndex != -1) {
                return false;
            }
            toExchangeIndex = i;
        }
    }

    if (toExchangeIndex == -1) {
        return false;
    }

    toExchange->setPlayerOwnerID(this->player->getPlayerId());
    this->player->getOwnedCountries()->push_back(defendingPlayer->getOwnedCountries()->at(toExchangeIndex));
    defendingPlayer->getOwnedCountries()->erase(defendingPlayer->getOwnedCountries()->begin() + toExchangeIndex);
    return true;
}